

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

void __thiscall
wasm::SExpressionWasmBuilder::parseTag(SExpressionWasmBuilder *this,Element *s,bool preParseImport)

{
  Module *pMVar1;
  char *pcVar2;
  bool bVar3;
  Element *pEVar4;
  pointer pTVar5;
  Tag *pTVar6;
  char *pcVar7;
  pointer pEVar8;
  Export *pEVar9;
  size_t sVar10;
  ParseException *pPVar11;
  uint uVar12;
  IString str;
  IString str_00;
  allocator<char> local_2c9;
  string local_2c8;
  Signature local_2a8;
  HeapType local_298;
  HeapType tagType;
  string local_288;
  size_t local_268;
  char *pcStack_260;
  string_view local_250;
  Name local_240;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_230;
  __single_object ex;
  string local_220;
  undefined1 local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  undefined1 local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  Element *local_1b0;
  Element *exportElem;
  size_t sStack_1a0;
  string_view local_198;
  Name local_188;
  string_view local_178;
  Name local_168;
  undefined1 local_152;
  allocator<char> local_151;
  string local_150;
  undefined1 local_12a;
  allocator<char> local_129;
  string local_128;
  undefined1 local_102;
  allocator<char> local_101;
  string local_100;
  Element *local_e0;
  Element *importElem;
  size_t sStack_d0;
  size_t local_c8;
  char *pcStack_c0;
  string_view local_b0;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98;
  size_t local_78;
  char *pcStack_70;
  string_view local_68;
  string_view local_58;
  Element *local_48;
  Element *inner;
  char *local_30;
  size_t i;
  __single_object tag;
  bool preParseImport_local;
  Element *s_local;
  SExpressionWasmBuilder *this_local;
  
  tag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
  super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._7_1_ = preParseImport;
  std::make_unique<wasm::Tag>();
  local_30 = (char *)0x1;
  pEVar4 = Element::operator[](s,1);
  bVar3 = Element::isStr(pEVar4);
  if (bVar3) {
    pEVar4 = Element::operator[](s,(uint)local_30);
    bVar3 = Element::dollared(pEVar4);
    if (!bVar3) goto LAB_01c4f15c;
    uVar12 = (uint)local_30;
    local_30 = local_30 + 1;
    local_48 = Element::operator[](s,uVar12);
    pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                       ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&i);
    local_68 = (string_view)Element::str(local_48);
    wasm::Name::Name((Name *)&local_58,(IString)local_68);
    Named::setExplicitName((Named *)pTVar5,(Name)local_58);
    pMVar1 = this->wasm;
    pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                       ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&i);
    local_78 = (pTVar5->super_Importable).super_Named.name.super_IString.str._M_len;
    pcStack_70 = (pTVar5->super_Importable).super_Named.name.super_IString.str._M_str;
    pTVar6 = Module::getTagOrNull
                       (pMVar1,(Name)(pTVar5->super_Importable).super_Named.name.super_IString.str);
    if (pTVar6 != (Tag *)0x0) {
      local_9a = 1;
      pPVar11 = (ParseException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"duplicate tag",&local_99);
      ParseException::ParseException(pPVar11,&local_98,local_48->line,local_48->col);
      local_9a = 0;
      __cxa_throw(pPVar11,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
  else {
LAB_01c4f15c:
    local_b0 = (string_view)wasm::Name::fromInt((long)this->tagCounter);
    pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                       ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&i);
    wasm::Name::operator=((Name *)pTVar5,(Name *)&local_b0);
    pMVar1 = this->wasm;
    pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                       ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&i);
    local_c8 = (pTVar5->super_Importable).super_Named.name.super_IString.str._M_len;
    pcStack_c0 = (pTVar5->super_Importable).super_Named.name.super_IString.str._M_str;
    pTVar6 = Module::getTagOrNull
                       (pMVar1,(Name)(pTVar5->super_Importable).super_Named.name.super_IString.str);
    if (pTVar6 != (Tag *)0x0) {
      __assert_fail("!wasm.getTagOrNull(tag->name)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-s-parser.cpp"
                    ,0xf78,"void wasm::SExpressionWasmBuilder::parseTag(Element &, bool)");
    }
  }
  this->tagCounter = this->tagCounter + 1;
  pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                     ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&i);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&this->tagNames,(value_type *)pTVar5);
  pcVar2 = local_30;
  pcVar7 = (char *)Element::size(s);
  if (pcVar2 < pcVar7) {
    pEVar4 = Element::operator[](s,(uint)local_30);
    importElem = IMPORT;
    sStack_d0 = DAT_027e57d0;
    str.str._M_str = pcVar7;
    str.str._M_len = DAT_027e57d0;
    bVar3 = elementStartsWith((wasm *)pEVar4,IMPORT,str);
    if (bVar3) {
      if ((tag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
           super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._7_1_ & 1) == 0) {
        __assert_fail("preParseImport && \"import element in non-preParseImport mode\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-s-parser.cpp"
                      ,0xf7f,"void wasm::SExpressionWasmBuilder::parseTag(Element &, bool)");
      }
      uVar12 = (uint)local_30;
      local_30 = local_30 + 1;
      local_e0 = Element::operator[](s,uVar12);
      sVar10 = Element::size(local_e0);
      if (sVar10 != 3) {
        local_102 = 1;
        pPVar11 = (ParseException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"invalid import",&local_101);
        ParseException::ParseException(pPVar11,&local_100,local_e0->line,local_e0->col);
        local_102 = 0;
        __cxa_throw(pPVar11,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar4 = Element::operator[](local_e0,1);
      bVar3 = Element::isStr(pEVar4);
      if (!bVar3) {
LAB_01c4f4ed:
        local_12a = 1;
        pPVar11 = (ParseException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"invalid import module name",&local_129);
        pEVar4 = Element::operator[](local_e0,1);
        sVar10 = pEVar4->line;
        pEVar4 = Element::operator[](local_e0,1);
        ParseException::ParseException(pPVar11,&local_128,sVar10,pEVar4->col);
        local_12a = 0;
        __cxa_throw(pPVar11,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar4 = Element::operator[](local_e0,1);
      bVar3 = Element::dollared(pEVar4);
      if (bVar3) goto LAB_01c4f4ed;
      pEVar4 = Element::operator[](local_e0,2);
      bVar3 = Element::isStr(pEVar4);
      if (!bVar3) {
LAB_01c4f68c:
        local_152 = 1;
        pPVar11 = (ParseException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"invalid import base name",&local_151);
        pEVar4 = Element::operator[](local_e0,2);
        sVar10 = pEVar4->line;
        pEVar4 = Element::operator[](local_e0,2);
        ParseException::ParseException(pPVar11,&local_150,sVar10,pEVar4->col);
        local_152 = 0;
        __cxa_throw(pPVar11,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar4 = Element::operator[](local_e0,2);
      bVar3 = Element::dollared(pEVar4);
      if (bVar3) goto LAB_01c4f68c;
      pEVar4 = Element::operator[](local_e0,1);
      local_178 = (string_view)Element::str(pEVar4);
      wasm::Name::Name(&local_168,(IString)local_178);
      pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                         ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&i);
      wasm::Name::operator=(&(pTVar5->super_Importable).module,&local_168);
      pEVar4 = Element::operator[](local_e0,2);
      local_198 = (string_view)Element::str(pEVar4);
      wasm::Name::Name(&local_188,(IString)local_198);
      pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                         ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&i);
      wasm::Name::operator=(&(pTVar5->super_Importable).base,&local_188);
    }
  }
  pcVar2 = local_30;
  pcVar7 = (char *)Element::size(s);
  if (pcVar2 < pcVar7) {
    pEVar4 = Element::operator[](s,(uint)local_30);
    exportElem = EXPORT;
    sStack_1a0 = DAT_027e57c0;
    str_00.str._M_str = pcVar7;
    str_00.str._M_len = DAT_027e57c0;
    bVar3 = elementStartsWith((wasm *)pEVar4,EXPORT,str_00);
    if (bVar3) {
      uVar12 = (uint)local_30;
      local_30 = local_30 + 1;
      local_1b0 = Element::operator[](s,uVar12);
      pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                         ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&i);
      bVar3 = IString::is(&(pTVar5->super_Importable).module.super_IString);
      if (bVar3) {
        local_1d2 = 1;
        pPVar11 = (ParseException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,"import and export cannot be specified together",&local_1d1)
        ;
        ParseException::ParseException(pPVar11,&local_1d0,local_1b0->line,local_1b0->col);
        local_1d2 = 0;
        __cxa_throw(pPVar11,&ParseException::typeinfo,ParseException::~ParseException);
      }
      sVar10 = Element::size(local_1b0);
      if (sVar10 != 2) {
        local_1fa = 1;
        pPVar11 = (ParseException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"invalid export",&local_1f9);
        ParseException::ParseException(pPVar11,&local_1f8,local_1b0->line,local_1b0->col);
        local_1fa = 0;
        __cxa_throw(pPVar11,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar4 = Element::operator[](local_1b0,1);
      bVar3 = Element::isStr(pEVar4);
      if (bVar3) {
        pEVar4 = Element::operator[](local_1b0,1);
        bVar3 = Element::dollared(pEVar4);
        if (!bVar3) {
          std::make_unique<wasm::Export>();
          pEVar4 = Element::operator[](local_1b0,1);
          local_250 = (string_view)Element::str(pEVar4);
          wasm::Name::Name(&local_240,(IString)local_250);
          pEVar8 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                             (&local_230);
          wasm::Name::operator=(&pEVar8->name,&local_240);
          pMVar1 = this->wasm;
          pEVar8 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                             (&local_230);
          local_268 = (pEVar8->name).super_IString.str._M_len;
          pcStack_260 = (pEVar8->name).super_IString.str._M_str;
          pEVar9 = Module::getExportOrNull(pMVar1,(Name)(pEVar8->name).super_IString.str);
          if (pEVar9 != (Export *)0x0) {
            tagType.id._6_1_ = 1;
            pPVar11 = (ParseException *)__cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_288,"duplicate export",
                       (allocator<char> *)((long)&tagType.id + 7));
            pEVar4 = Element::operator[](local_1b0,1);
            sVar10 = pEVar4->line;
            pEVar4 = Element::operator[](local_1b0,1);
            ParseException::ParseException(pPVar11,&local_288,sVar10,pEVar4->col);
            tagType.id._6_1_ = 0;
            __cxa_throw(pPVar11,&ParseException::typeinfo,ParseException::~ParseException);
          }
          pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                             ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&i);
          pEVar8 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                             (&local_230);
          wasm::Name::operator=(&pEVar8->value,(Name *)pTVar5);
          pEVar8 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                             (&local_230);
          pEVar8->kind = Tag;
          pMVar1 = this->wasm;
          pEVar8 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::release
                             (&local_230);
          Module::addExport(pMVar1,pEVar8);
          std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_230)
          ;
          goto LAB_01c50000;
        }
      }
      ex._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl._6_1_ = 1;
      pPVar11 = (ParseException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"invalid export name",
                 (allocator<char> *)
                 ((long)&ex._M_t.
                         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 7));
      pEVar4 = Element::operator[](local_1b0,1);
      sVar10 = pEVar4->line;
      pEVar4 = Element::operator[](local_1b0,1);
      ParseException::ParseException(pPVar11,&local_220,sVar10,pEVar4->col);
      ex._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl._6_1_ = 0;
      __cxa_throw(pPVar11,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
LAB_01c50000:
  HeapType::HeapType(&local_298);
  local_30 = (char *)parseTypeUse(this,s,(size_t)local_30,&local_298);
  local_2a8 = HeapType::getSignature(&local_298);
  pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                     ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&i);
  pcVar2 = local_30;
  pTVar5->sig = local_2a8;
  sVar10 = Element::size(s);
  if (pcVar2 < sVar10) {
    pPVar11 = (ParseException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"invalid element",&local_2c9);
    pEVar4 = Element::operator[](s,(uint)local_30);
    sVar10 = pEVar4->line;
    pEVar4 = Element::operator[](s,(uint)local_30);
    ParseException::ParseException(pPVar11,&local_2c8,sVar10,pEVar4->col);
    __cxa_throw(pPVar11,&ParseException::typeinfo,ParseException::~ParseException);
  }
  pMVar1 = this->wasm;
  pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::release
                     ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&i);
  Module::addTag(pMVar1,pTVar5);
  std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr
            ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&i);
  return;
}

Assistant:

void SExpressionWasmBuilder::parseTag(Element& s, bool preParseImport) {
  auto tag = std::make_unique<Tag>();
  size_t i = 1;

  // Parse name
  if (s[i]->isStr() && s[i]->dollared()) {
    auto& inner = *s[i++];
    tag->setExplicitName(inner.str());
    if (wasm.getTagOrNull(tag->name)) {
      throw ParseException("duplicate tag", inner.line, inner.col);
    }
  } else {
    tag->name = Name::fromInt(tagCounter);
    assert(!wasm.getTagOrNull(tag->name));
  }
  tagCounter++;
  tagNames.push_back(tag->name);

  // Parse import, if any
  if (i < s.size() && elementStartsWith(*s[i], IMPORT)) {
    assert(preParseImport && "import element in non-preParseImport mode");
    auto& importElem = *s[i++];
    if (importElem.size() != 3) {
      throw ParseException("invalid import", importElem.line, importElem.col);
    }
    if (!importElem[1]->isStr() || importElem[1]->dollared()) {
      throw ParseException(
        "invalid import module name", importElem[1]->line, importElem[1]->col);
    }
    if (!importElem[2]->isStr() || importElem[2]->dollared()) {
      throw ParseException(
        "invalid import base name", importElem[2]->line, importElem[2]->col);
    }
    tag->module = importElem[1]->str();
    tag->base = importElem[2]->str();
  }

  // Parse export, if any
  if (i < s.size() && elementStartsWith(*s[i], EXPORT)) {
    auto& exportElem = *s[i++];
    if (tag->module.is()) {
      throw ParseException("import and export cannot be specified together",
                           exportElem.line,
                           exportElem.col);
    }
    if (exportElem.size() != 2) {
      throw ParseException("invalid export", exportElem.line, exportElem.col);
    }
    if (!exportElem[1]->isStr() || exportElem[1]->dollared()) {
      throw ParseException(
        "invalid export name", exportElem[1]->line, exportElem[1]->col);
    }
    auto ex = std::make_unique<Export>();
    ex->name = exportElem[1]->str();
    if (wasm.getExportOrNull(ex->name)) {
      throw ParseException(
        "duplicate export", exportElem[1]->line, exportElem[1]->col);
    }
    ex->value = tag->name;
    ex->kind = ExternalKind::Tag;
    wasm.addExport(ex.release());
  }

  // Parse typeuse
  HeapType tagType;
  i = parseTypeUse(s, i, tagType);
  tag->sig = tagType.getSignature();

  // If there are more elements, they are invalid
  if (i < s.size()) {
    throw ParseException("invalid element", s[i]->line, s[i]->col);
  }

  wasm.addTag(tag.release());
}